

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noop.cc
# Opt level: O3

base_learner * noop_setup(options_i *options,vw *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  learner<char,_example> *plVar2;
  bool noop;
  option_group_definition new_options;
  bool local_201;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  string local_1e0;
  option_group_definition local_1c0;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [112];
  bool local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  typed_option<bool> local_c8;
  
  local_201 = false;
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Noop Learner","");
  paVar1 = &local_1c0.m_name.field_2;
  local_1c0.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1c0,local_188,local_188 + local_180);
  local_1c0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"noop","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_168,&local_1e0,&local_201);
  local_f8 = true;
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"do no learning","");
  std::__cxx11::string::_M_assign((string *)(local_168 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c8,(typed_option<bool> *)local_168);
  VW::config::option_group_definition::add<bool>(&local_1c0,&local_c8);
  local_c8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002edc98;
  if (local_c8.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_c8.super_base_option);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0]);
  }
  local_168._0_8_ = &PTR__typed_option_002edc98;
  if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1c0);
  if (local_201 == false) {
    plVar2 = (learner<char,_example> *)0x0;
  }
  else {
    plVar2 = LEARNER::init_learner<char,example,LEARNER::learner<char,char>>(learn,1);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1c0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0.m_name._M_dataplus._M_p);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* noop_setup(options_i& options, vw&)
{
  bool noop = false;
  option_group_definition new_options("Noop Learner");
  new_options.add(make_option("noop", noop).keep().help("do no learning"));
  options.add_and_parse(new_options);

  if (!noop)
    return nullptr;

  return make_base(LEARNER::init_learner(learn, 1));
}